

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listimagewindow.cc
# Opt level: O0

void __thiscall
bgui::ListImageWindow::add(ListImageWindow *this,ImageFloat *image,string *s,bool copy)

{
  void *pvVar1;
  long lVar2;
  size_type sVar3;
  byte in_CL;
  ListImageWindow *in_RSI;
  BaseWindow *in_RDI;
  int h;
  int w;
  ostringstream out;
  ImageAdapterBase *adapt;
  ImageFloat *im;
  undefined7 in_stack_fffffffffffffde8;
  undefined1 in_stack_fffffffffffffdef;
  BaseWindow *in_stack_fffffffffffffdf0;
  Image<float,_gimage::PixelTraits<float>_> *in_stack_fffffffffffffdf8;
  ostringstream *this_00;
  Image<float,_gimage::PixelTraits<float>_> *in_stack_fffffffffffffe00;
  ListImageWindow *in_stack_fffffffffffffe10;
  double in_stack_fffffffffffffe20;
  Image<float,_gimage::PixelTraits<float>_> *in_stack_fffffffffffffe28;
  ImageAdapter<float> *in_stack_fffffffffffffe30;
  ostringstream local_1b8 [376];
  void *local_40;
  ListImageWindow *local_28;
  byte local_19;
  
  local_19 = in_CL & 1;
  local_28 = in_RSI;
  if (local_19 != 0) {
    in_stack_fffffffffffffe10 = (ListImageWindow *)operator_new(0x38);
    gimage::Image<float,_gimage::PixelTraits<float>_>::Image
              (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    local_28 = in_stack_fffffffffffffe10;
  }
  pvVar1 = operator_new(0xa8);
  ImageAdapter<float>::ImageAdapter
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
             (double)in_RDI,SUB81((ulong)in_stack_fffffffffffffe10 >> 0x38,0));
  local_40 = pvVar1;
  std::vector<bgui::ImageAdapterBase_*,_std::allocator<bgui::ImageAdapterBase_*>_>::push_back
            ((vector<bgui::ImageAdapterBase_*,_std::allocator<bgui::ImageAdapterBase_*>_> *)
             in_stack_fffffffffffffe00,(value_type *)in_stack_fffffffffffffdf8);
  lVar2 = std::__cxx11::string::size();
  if (lVar2 == 0) {
    this_00 = local_1b8;
    std::__cxx11::ostringstream::ostringstream(this_00);
    in_stack_fffffffffffffe00 =
         (Image<float,_gimage::PixelTraits<float>_> *)std::operator<<((ostream *)this_00,"Image ");
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&in_RDI[5].p);
    std::ostream::operator<<(in_stack_fffffffffffffe00,sVar3);
    in_stack_fffffffffffffdf0 = (BaseWindow *)&in_RDI[5].p;
    std::__cxx11::ostringstream::str();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffdf0,
                (value_type *)CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe28);
    std::__cxx11::ostringstream::~ostringstream(local_1b8);
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffe00,(value_type *)in_stack_fffffffffffffdf8);
  }
  sVar3 = std::vector<bgui::ImageAdapterBase_*,_std::allocator<bgui::ImageAdapterBase_*>_>::size
                    ((vector<bgui::ImageAdapterBase_*,_std::allocator<bgui::ImageAdapterBase_*>_> *)
                     (in_RDI + 7));
  if (sVar3 == 1) {
    BaseWindow::getDisplaySize
              (in_RDI,(int *)&stack0xfffffffffffffe24,(int *)&stack0xfffffffffffffe20);
    *(undefined4 *)&in_RDI[8].p = 0;
    set(in_stack_fffffffffffffe10,(int)((ulong)pvVar1 >> 0x20),(int)pvVar1,
        (int)((ulong)in_stack_fffffffffffffe00 >> 0x20),
        SUB81((ulong)in_stack_fffffffffffffe00 >> 0x18,0));
    BaseWindow::setVisible(in_stack_fffffffffffffdf0,(bool)in_stack_fffffffffffffdef);
  }
  return;
}

Assistant:

void ListImageWindow::add(const gimage::ImageFloat &image, const std::string &s, bool copy)
{
  const gimage::ImageFloat *im=&image;

  if (copy)
  {
    im=new gimage::ImageFloat(image);
  }

  ImageAdapterBase *adapt=new ImageAdapter<float>(im, vmin, vmax, copy);

  list.push_back(adapt);

  if (s.size() == 0)
  {
    std::ostringstream out;

    out << "Image " << name.size();

    name.push_back(out.str());
  }
  else
  {
    name.push_back(s);
  }

  if (list.size() == 1)
  {
    int w, h;

    getDisplaySize(w, h);

    current=0;
    set(current, w, h, true);

    setVisible(true);
  }
}